

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_WahWah.cpp
# Opt level: O1

int WahWah::InternalRegisterEffectDefinition(UnityAudioEffectDefinition *definition)

{
  UnityAudioParameterDefinition *pUVar1;
  
  pUVar1 = (UnityAudioParameterDefinition *)operator_new__(0x200);
  definition->paramdefs = pUVar1;
  RegisterParameter(definition,"Attack Time","s",0.001,2.0,0.1,1.0,3.0,0,"Attack time");
  RegisterParameter(definition,"Release Time","s",0.001,2.0,0.5,1.0,3.0,1,"Release time");
  RegisterParameter(definition,"Base Level","%",0.0,1.0,0.1,100.0,1.0,2,"Base filter level");
  RegisterParameter(definition,"Sensitivity","%",-1.0,1.0,0.1,100.0,1.0,3,"Filter sensitivity");
  RegisterParameter(definition,"Resonance","%",0.0,1.0,0.1,100.0,1.0,4,"Filter resonance");
  RegisterParameter(definition,"Type","",0.0,1.0,0.0,1.0,1.0,5,
                    "Filter type (0 = lowpass, 1 = bandpass)");
  RegisterParameter(definition,"Depth","",0.0,1.0,0.0,1.0,1.0,6,
                    "Filter depth (0 = 12 dB, 1 = 24 dB)");
  RegisterParameter(definition,"Sidechain Mix","%",0.0,1.0,0.0,100.0,1.0,7,
                    "Sidechain mix (0 = use input, 1 = use sidechain)");
  *(byte *)&definition->flags = (byte)definition->flags | 1;
  return 8;
}

Assistant:

int InternalRegisterEffectDefinition(UnityAudioEffectDefinition& definition)
    {
        int numparams = P_NUM;
        definition.paramdefs = new UnityAudioParameterDefinition[numparams];
        RegisterParameter(definition, "Attack Time", "s", 0.001f, 2.0f, 0.1f, 1.0f, 3.0f, P_ATK, "Attack time");
        RegisterParameter(definition, "Release Time", "s", 0.001f, 2.0f, 0.5f, 1.0f, 3.0f, P_REL, "Release time");
        RegisterParameter(definition, "Base Level", "%", 0.0f, 1.0f, 0.1f, 100.0f, 1.0f, P_BASE, "Base filter level");
        RegisterParameter(definition, "Sensitivity", "%", -1.0f, 1.0f, 0.1f, 100.0f, 1.0f, P_SENS, "Filter sensitivity");
        RegisterParameter(definition, "Resonance", "%", 0.0f, 1.0f, 0.1f, 100.0f, 1.0f, P_RESO, "Filter resonance");
        RegisterParameter(definition, "Type", "", 0.0f, 1.0f, 0.0f, 1.0f, 1.0f, P_TYPE, "Filter type (0 = lowpass, 1 = bandpass)");
        RegisterParameter(definition, "Depth", "", 0.0f, 1.0f, 0.0f, 1.0f, 1.0f, P_DEPTH, "Filter depth (0 = 12 dB, 1 = 24 dB)");
        RegisterParameter(definition, "Sidechain Mix", "%", 0.0f, 1.0f, 0.0f, 100.0f, 1.0f, P_SIDECHAIN, "Sidechain mix (0 = use input, 1 = use sidechain)");
        definition.flags |= UnityAudioEffectDefinitionFlags_IsSideChainTarget;
        return numparams;
    }